

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int id;
  int len;
  undefined8 local_38;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  clear(this);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  iVar1 = (*dr->_vptr_DataReader[3])(dr,&local_38,4);
  if ((ParamDict *)CONCAT44(extraout_var,iVar1) == (ParamDict *)0x4) {
    do {
      if ((long)(int)local_38 == -0xe9) {
        return 0;
      }
      if ((int)local_38 < -0x5b03) {
        local_38 = (ulong)(-(int)local_38 - 0x5b04);
        iVar1 = (*dr->_vptr_DataReader[3])(dr,(long)&local_38 + 4,4);
        if ((ParamDict *)CONCAT44(extraout_var_00,iVar1) != (ParamDict *)0x4) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_00,iVar1));
          return -1;
        }
        Mat::create(&this->params[(int)local_38].v,local_38._4_4_,4,(Allocator *)0x0);
        iVar1 = (*dr->_vptr_DataReader[3])
                          (dr,this->params[(int)local_38].v.data,(long)(int)local_38._4_4_ << 2);
        if ((ParamDict *)CONCAT44(extraout_var_01,iVar1) !=
            (ParamDict *)((long)(int)local_38._4_4_ * 4)) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_01,iVar1));
          return -1;
        }
        this->params[(int)local_38].type = 4;
      }
      else {
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&this->params[(int)local_38].field_1,4);
        if ((ParamDict *)CONCAT44(extraout_var_02,iVar1) != (ParamDict *)0x4) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_02,iVar1));
          return -1;
        }
        this->params[(int)local_38].type = 1;
      }
      iVar1 = (*dr->_vptr_DataReader[3])(dr,&local_38,4);
    } while ((ParamDict *)CONCAT44(extraout_var_03,iVar1) == (ParamDict *)0x4);
    load_param_bin((ParamDict *)CONCAT44(extraout_var_03,iVar1));
  }
  else {
    load_param_bin((ParamDict *)CONCAT44(extraout_var,iVar1));
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }
    }

    return 0;
}